

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_spawn.cxx
# Opt level: O2

void __thiscall xray_re::xr_level_spawn::load(xr_level_spawn *this,xr_reader *r)

{
  xr_reader *this_00;
  size_t size;
  char *name;
  uint32_t id;
  uint16_t pkt_id;
  cse_abstract *entity;
  xr_reader *s;
  xr_packet packet;
  
  id = 0;
  while( true ) {
    s = xr_reader::open_chunk(r,id);
    if (s == (xr_reader *)0x0) {
      return;
    }
    xr_packet::xr_packet(&packet);
    this_00 = s;
    size = xr_reader::size(s);
    xr_reader::r_packet(this_00,&packet,size);
    xr_packet::r_begin(&packet,&pkt_id);
    if (pkt_id != 1) break;
    name = xr_packet::skip_sz(&packet);
    packet.m_r_pos = 0;
    entity = create_entity(name);
    if (entity != (cse_abstract *)0x0) {
      cse_abstract::spawn_read(entity,&packet);
      if (packet.m_r_pos != packet.m_w_pos) {
        msg("reading %s (%s): %u <> %u",(entity->m_s_name_replace)._M_dataplus._M_p,name);
      }
      std::vector<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>::push_back
                (&this->m_spawns,&entity);
    }
    xr_reader::close_chunk(r,&s);
    id = id + 1;
  }
  __assert_fail("pkt_id == M_SPAWN",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_spawn.cxx"
                ,0x16,"void xray_re::xr_level_spawn::load(xr_reader &)");
}

Assistant:

void xr_level_spawn::load(xr_reader& r)
{
	xr_reader* s;
	for (uint32_t id = 0; (s = r.open_chunk(id)); ++id) {
		xr_packet packet;
		s->r_packet(packet, s->size());
		uint16_t pkt_id;
		packet.r_begin(pkt_id);
		xr_assert(pkt_id == M_SPAWN);
		const char* name = packet.skip_sz();
		packet.r_seek(0);
		// just skip the spawn record if we can't create it.
		if (cse_abstract* entity = create_entity(name)) {
			entity->spawn_read(packet);
			if (!packet.r_eof()) {
				msg("reading %s (%s): %u <> %u", entity->name_replace().c_str(),
						name, packet.r_tell(), packet.w_tell());
			}
			m_spawns.push_back(entity);
		}
		r.close_chunk(s);
	}
}